

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall History::split(History *this,string *s,string *separator)

{
  ulong in_RCX;
  string *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_t prev_pos;
  size_t pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elements;
  value_type *in_stack_ffffffffffffff48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  long lVar1;
  string local_88 [48];
  string local_58 [32];
  long local_38;
  long local_30;
  undefined1 local_21;
  ulong local_20;
  string *local_18;
  
  local_21 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1bff51);
  local_30 = 0;
  local_38 = 0;
  while (local_30 = std::__cxx11::string::find(local_18,local_20), local_30 != -1) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)local_18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_58);
    lVar1 = local_30;
    local_38 = std::__cxx11::string::size();
    local_38 = lVar1 + local_38;
  }
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_88,(ulong)local_18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_18,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_88);
  return in_RDI;
}

Assistant:

std::vector<std::string> split(const std::string& s,
                                 const std::string& separator) {
    std::vector<std::string> elements;
    size_t pos = 0;
    size_t prev_pos = 0;

    while ((pos = s.find(separator, prev_pos)) != std::string::npos) {
      elements.push_back(s.substr(prev_pos, pos - prev_pos));
      prev_pos = pos + separator.size();
    }

    elements.push_back(s.substr(prev_pos, s.size() - prev_pos));

    return elements;
  }